

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_large(chunk_conflict *c,loc centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t y2_00;
  wchar_t x1_00;
  wchar_t x2_00;
  int iVar4;
  int iVar5;
  loc_conflict grid_00;
  loc lVar6;
  wchar_t i_1;
  wchar_t i;
  loc grid;
  wchar_t light;
  wchar_t width;
  wchar_t height;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  wchar_t x;
  wchar_t y;
  wchar_t rating_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  iVar4 = c->depth;
  unique0x100009b0 = centre;
  uVar2 = Rand_div(0x19);
  grid.x = (int)(iVar4 <= (int)(uVar2 + 1));
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',L'\x19');
  if (((iStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var1 = find_space((loc *)((long)&c_local + 4),L'\v',L'\x19'), _Var1)) {
    iVar5 = iStack_10;
    wVar3 = iStack_10 + L'\xfffffffc';
    y2_00 = iStack_10 + L'\x04';
    iVar4 = c_local._4_4_;
    x1_00 = c_local._4_4_ + L'\xfffffff5';
    x2_00 = c_local._4_4_ + L'\v';
    generate_room(c,iStack_10 + L'\xfffffffb',c_local._4_4_ + L'\xfffffff4',iStack_10 + L'\x05',
                  c_local._4_4_ + L'\f',grid.x);
    draw_rectangle(c,iVar5 + L'\xfffffffb',iVar4 + L'\xfffffff4',iVar5 + L'\x05',iVar4 + L'\f',
                   FEAT_GRANITE,L'\f',false);
    fill_rectangle(c,wVar3,x1_00,y2_00,x2_00,FEAT_FLOOR,L'\0');
    y1 = iVar5 + L'\xfffffffe';
    draw_rectangle(c,iVar5 + L'\xfffffffd',iVar4 + L'\xfffffff6',iVar5 + L'\x03',iVar4 + L'\n',
                   FEAT_GRANITE,L'\v',false);
    uVar2 = Rand_div(5);
    switch(uVar2) {
    case 0:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plain");
      generate_hole(c,iVar5 + L'\xfffffffd',iVar4 + L'\xfffffff6',iVar5 + L'\x03',iVar4 + L'\n',
                    FEAT_CLOSED);
      vault_monsters(c,stack0xffffffffffffffec,c->depth + L'\x02',L'\x01');
      break;
    case 1:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"nested");
      generate_hole(c,iVar5 + L'\xfffffffd',iVar4 + L'\xfffffff6',iVar5 + L'\x03',iVar4 + L'\n',
                    FEAT_CLOSED);
      draw_rectangle(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\xffffffff',iStack_10 + L'\x01',
                     c_local._4_4_ + L'\x01',FEAT_GRANITE,L'\v',false);
      generate_hole(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\xffffffff',iStack_10 + L'\x01',
                    c_local._4_4_ + L'\x01',FEAT_CLOSED);
      for (y1 = iStack_10 + L'\xffffffff'; y1 <= iStack_10 + L'\x01'; y1 = y1 + L'\x01') {
        for (x1 = c_local._4_4_ + L'\xffffffff'; x1 <= c_local._4_4_ + L'\x01'; x1 = x1 + L'\x01') {
          grid_00 = (loc_conflict)loc(x1,y1);
          _Var1 = square_iscloseddoor((chunk *)c,grid_00);
          if (_Var1) {
            uVar2 = Rand_div(7);
            square_set_door_lock((chunk_conflict2 *)c,grid_00,uVar2 + L'\x01');
          }
        }
      }
      iVar4 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters(c,stack0xffffffffffffffec,iVar4 + L'\x02',uVar2 + L'\x03');
      uVar2 = Rand_div(100);
      if (((int)uVar2 < 0x50) || ((dun->persist & 1U) != 0)) {
        place_object(c,stack0xffffffffffffffec,c->depth,false,false,'\x03',L'\0');
      }
      else {
        place_random_stairs(c,stack0xffffffffffffffec);
      }
      uVar2 = Rand_div(3);
      vault_traps(c,stack0xffffffffffffffec,L'\x04',L'\n',uVar2 + L'\x03');
      break;
    case 2:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
      generate_hole(c,iVar5 + L'\xfffffffd',iVar4 + L'\xfffffff6',iVar5 + L'\x03',iVar4 + L'\n',
                    FEAT_CLOSED);
      fill_rectangle(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\xffffffff',iStack_10 + L'\x01',
                     c_local._4_4_ + L'\x01',FEAT_GRANITE,L'\v');
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        uVar2 = Rand_div(2);
        if (uVar2 == 0) {
          fill_rectangle(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\xfffffff9',
                         iStack_10 + L'\x01',c_local._4_4_ + L'\xfffffffb',FEAT_GRANITE,L'\v');
          fill_rectangle(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\x05',iStack_10 + L'\x01',
                         c_local._4_4_ + L'\a',FEAT_GRANITE,L'\v');
        }
        else {
          fill_rectangle(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\xfffffffa',
                         iStack_10 + L'\x01',c_local._4_4_ + L'\xfffffffc',FEAT_GRANITE,L'\v');
          fill_rectangle(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\x04',iStack_10 + L'\x01',
                         c_local._4_4_ + L'\x06',FEAT_GRANITE,L'\v');
        }
      }
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        draw_rectangle(c,iStack_10 + L'\xffffffff',c_local._4_4_ + L'\xfffffffb',iStack_10 + L'\x01'
                       ,c_local._4_4_ + L'\x05',FEAT_GRANITE,L'\v',false);
        iVar4 = c_local._4_4_ + -3;
        iVar5 = iStack_10 + -3;
        uVar2 = Rand_div(2);
        lVar6 = loc(iVar4,iVar5 + (uVar2 + 1) * 2);
        place_secret_door(c,lVar6);
        iVar4 = c_local._4_4_ + 3;
        iVar5 = iStack_10 + -3;
        uVar2 = Rand_div(2);
        lVar6 = loc(iVar4,iVar5 + (uVar2 + 1) * 2);
        place_secret_door(c,lVar6);
        lVar6 = loc(c_local._4_4_ + -2,iStack_10);
        iVar4 = c->depth;
        uVar2 = Rand_div(2);
        vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
        lVar6 = loc(c_local._4_4_ + 2,iStack_10);
        iVar4 = c->depth;
        uVar2 = Rand_div(2);
        vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
        uVar2 = Rand_div(3);
        if (uVar2 == 0) {
          lVar6 = loc(c_local._4_4_ + -2,iStack_10);
          place_object(c,lVar6,c->depth,false,false,'\x03',L'\0');
        }
        uVar2 = Rand_div(3);
        if (uVar2 == 0) {
          lVar6 = loc(c_local._4_4_ + 2,iStack_10);
          place_object(c,lVar6,c->depth,false,false,'\x03',L'\0');
        }
      }
      break;
    case 3:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"checkerboard");
      generate_hole(c,iVar5 + L'\xfffffffd',iVar4 + L'\xfffffff6',iVar5 + L'\x03',iVar4 + L'\n',
                    FEAT_CLOSED);
      for (; x1 = iVar4 + L'\xfffffff7', y1 <= iVar5 + L'\x02'; y1 = y1 + L'\x01') {
        for (; x1 <= iVar4 + L'\t'; x1 = x1 + L'\x01') {
          if ((x1 + y1 & 1U) != 0) {
            lVar6 = loc(x1,y1);
            set_marked_granite(c,lVar6,L'\v');
          }
        }
      }
      lVar6 = loc(c_local._4_4_ + -5,iStack_10);
      iVar4 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
      lVar6 = loc(c_local._4_4_ + 5,iStack_10);
      iVar4 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
      lVar6 = loc(c_local._4_4_ + -3,iStack_10);
      uVar2 = Rand_div(3);
      vault_traps(c,lVar6,L'\x02',L'\b',uVar2 + L'\x01');
      lVar6 = loc(c_local._4_4_ + 3,iStack_10);
      uVar2 = Rand_div(3);
      vault_traps(c,lVar6,L'\x02',L'\b',uVar2 + L'\x01');
      vault_objects(c,stack0xffffffffffffffec,c->depth,L'\x03');
      break;
    case 4:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"compartments");
      generate_plus(c,y1,iVar4 + L'\xfffffff7',iVar5 + L'\x02',iVar4 + L'\t',FEAT_GRANITE,L'\v');
      uVar2 = Rand_div(100);
      if ((int)uVar2 < 0x32) {
        uVar2 = Rand_div(10);
        iVar4 = uVar2 + 1;
        lVar6 = loc(c_local._4_4_ - iVar4,iVar5 + -3);
        place_closed_door(c,lVar6);
        lVar6 = loc(c_local._4_4_ + iVar4,iVar5 + -3);
        place_closed_door(c,lVar6);
        lVar6 = loc(c_local._4_4_ - iVar4,iVar5 + 3);
        place_closed_door(c,lVar6);
        lVar6 = loc(c_local._4_4_ + iVar4,iVar5 + 3);
        place_closed_door(c,lVar6);
      }
      else {
        uVar2 = Rand_div(3);
        iVar5 = uVar2 + 1;
        lVar6 = loc(iVar4 + -10,iStack_10 + iVar5);
        place_closed_door(c,lVar6);
        lVar6 = loc(iVar4 + -10,iStack_10 - iVar5);
        place_closed_door(c,lVar6);
        lVar6 = loc(iVar4 + 10,iStack_10 + iVar5);
        place_closed_door(c,lVar6);
        lVar6 = loc(iVar4 + 10,iStack_10 - iVar5);
        place_closed_door(c,lVar6);
      }
      wVar3 = c->depth;
      uVar2 = Rand_div(2);
      vault_objects(c,stack0xffffffffffffffec,wVar3,uVar2 + L'\x03');
      lVar6 = loc(c_local._4_4_ + -4,iStack_10 + 1);
      iVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
      lVar6 = loc(c_local._4_4_ + 4,iStack_10 + 1);
      iVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
      lVar6 = loc(c_local._4_4_ + -4,iStack_10 + -1);
      iVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
      lVar6 = loc(c_local._4_4_ + 4,iStack_10 + -1);
      iVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters(c,lVar6,iVar4 + L'\x02',uVar2 + L'\x01');
    }
    centre_local.x._3_1_ = true;
  }
  else {
    centre_local.x._3_1_ = false;
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_large(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int height = 9;
	int width = 23;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* The inner room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);

	/* Inner room variations */
	switch (randint1(5)) {
		/* An inner room */
	case 1: {
		/* Open the inner room with a door and place a monster */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "plain");
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);
		vault_monsters(c, centre, c->depth + 2, 1);
		break;
	}


		/* An inner room with a small inner room */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "nested");

		/* Open the inner room with a door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Place another inner room */
		draw_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
			centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER, false);

		/* Open the inner room with a locked door */
		generate_hole(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
					  FEAT_CLOSED);
		for (y = centre.y - 1; y <= centre.y + 1; y++) {
			for (x = centre.x - 1; x <= centre.x + 1; x++) {
				struct loc grid = loc(x, y);
				if (square_iscloseddoor(c, grid)) {
					square_set_door_lock(c, grid, randint1(7));
				}
			}
		}

		/* Monsters to guard the treasure */
		vault_monsters(c, centre, c->depth + 2, randint1(3) + 2);

		/* Object (80%) or Stairs (20%) */
		if (randint0(100) < 80 || dun->persist) {
			place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);
		} else {
			place_random_stairs(c, centre);
		}

		/* Traps to protect the treasure */
		vault_traps(c, centre, 4, 10, 2 + randint1(3));

		break;
	}


		/* An inner room with an inner pillar or pillars */
	case 3: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillar");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Inner pillar */
		fill_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
					   centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Occasionally, two more Large Inner Pillars */
		if (one_in_(2)) {
			if (one_in_(2)) {
				fill_rectangle(c, centre.y - 1, centre.x - 7, centre.y + 1,
							   centre.x - 5, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 5, centre.y + 1,
							   centre.x + 7, FEAT_GRANITE, SQUARE_WALL_INNER);
			} else {
				fill_rectangle(c, centre.y - 1, centre.x - 6, centre.y + 1,
							   centre.x - 4, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 4, centre.y + 1,
							   centre.x + 6, FEAT_GRANITE, SQUARE_WALL_INNER);
			}
		}

		/* Occasionally, some Inner rooms */
		if (one_in_(3)) {
			/* Inner rectangle */
			draw_rectangle(c, centre.y - 1, centre.x - 5, centre.y + 1,
				centre.x + 5, FEAT_GRANITE,
				SQUARE_WALL_INNER, false);

			/* Secret doors (random top/bottom) */
			place_secret_door(c, loc(centre.x - 3,
									 centre.y - 3 + (randint1(2) * 2)));
			place_secret_door(c, loc(centre.x + 3,
									 centre.y - 3 + (randint1(2) * 2)));

			/* Monsters */
			vault_monsters(c, loc(centre.x - 2, centre.y), c->depth + 2,
						   randint1(2));
			vault_monsters(c, loc(centre.x + 2, centre.y), c->depth + 2,
						   randint1(2));

			/* Objects */
			if (one_in_(3))
				place_object(c, loc(centre.x - 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
			if (one_in_(3))
				place_object(c, loc(centre.x + 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
		}

		break;
	}


		/* An inner room with a checkerboard */
	case 4: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"checkerboard");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Checkerboard */
		for (y = y1; y <= y2; y++)
			for (x = x1; x <= x2; x++)
				if ((x + y) & 0x01)
					set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);

		/* Monsters just love mazes. */
		vault_monsters(c, loc(centre.x - 5, centre.y), c->depth + 2,
					   randint1(3));
		vault_monsters(c, loc(centre.x + 5, centre.y), c->depth + 2,
					   randint1(3));

		/* Traps make them entertaining. */
		vault_traps(c, loc(centre.x - 3, centre.y), 2, 8, randint1(3));
		vault_traps(c, loc(centre.x + 3, centre.y), 2, 8, randint1(3));

		/* Mazes should have some treasure too. */
		vault_objects(c, centre, c->depth, 3);

		break;
	}


		/* Four small rooms. */
	case 5: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"compartments");

		/* Inner "cross" */
		generate_plus(c, y1, x1, y2, x2, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Doors into the rooms */
		if (randint0(100) < 50) {
			int i = randint1(10);
			place_closed_door(c, loc(centre.x - i, y1 - 1));
			place_closed_door(c, loc(centre.x + i, y1 - 1));
			place_closed_door(c, loc(centre.x - i, y2 + 1));
			place_closed_door(c, loc(centre.x + i, y2 + 1));
		} else {
			int i = randint1(3);
			place_closed_door(c, loc(x1 - 1, centre.y + i));
			place_closed_door(c, loc(x1 - 1, centre.y - i));
			place_closed_door(c, loc(x2 + 1, centre.y + i));
			place_closed_door(c, loc(x2 + 1, centre.y - i));
		}

		/* Treasure, centered at the center of the cross */
		vault_objects(c, centre, c->depth, 2 + randint1(2));

		/* Gotta have some monsters */
		vault_monsters(c, loc(centre.x - 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x - 4, centre.y - 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y - 1), c->depth + 2,
					   randint1(4)); 

		break;
	}
	}

	return true;
}